

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O2

bool __thiscall
miniros::master::ParameterStorage::deleteParam(ParameterStorage *this,string *caller_id,string *key)

{
  bool bVar1;
  XmlRpcValue *this_00;
  bool bVar2;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar3;
  allocator<char> local_b9;
  string fullKey;
  string local_98;
  Path path;
  
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (deleteParam::loc.initialized_ == false) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"miniros.unknown_package",&local_b9);
    ::std::operator+(&fullKey,&local_98,".");
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path,
                     &fullKey,"rosparam");
    console::initializeLogLocation(&deleteParam::loc,(string *)&path,Info);
    ::std::__cxx11::string::~string((string *)&path);
    ::std::__cxx11::string::~string((string *)&fullKey);
    ::std::__cxx11::string::~string((string *)&local_98);
  }
  if (deleteParam::loc.level_ != Info) {
    console::setLogLocationLevel(&deleteParam::loc,Info);
    console::checkLogLocationEnabled(&deleteParam::loc);
  }
  if (deleteParam::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,deleteParam::loc.logger_,deleteParam::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/parameter_storage.cpp"
                   ,0x1d,
                   "bool miniros::master::ParameterStorage::deleteParam(const std::string &, const std::string &)"
                   ,"deleteParam %s from %s",(key->_M_dataplus)._M_p,(caller_id->_M_dataplus)._M_p);
  }
  names::resolve(&fullKey,caller_id,key,false);
  ::std::mutex::lock(&this->m_parameterLock);
  bVar1 = ::std::operator==(&fullKey,"/");
  if (bVar1) {
    XmlRpc::XmlRpcValue::Dict();
    XmlRpc::XmlRpcValue::operator=(&this->m_parameterRoot,(XmlRpcValue *)&path);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&path);
    bVar1 = true;
    checkParamUpdates(this,&fullKey,(RpcValue *)0x0);
  }
  else {
    names::Path::Path(&path);
    names::Path::fromString(&path,&fullKey);
    pVar3 = findParameter(this,&path,false);
    this_00 = pVar3.second;
    bVar2 = pVar3.first != (XmlRpcValue *)0x0;
    bVar1 = this_00 != (XmlRpcValue *)0x0 && bVar2;
    if (this_00 != (XmlRpcValue *)0x0 && bVar2) {
      names::Path::name_abi_cxx11_(&local_98,&path);
      XmlRpc::XmlRpcValue::eraseMember(this_00,&local_98);
      ::std::__cxx11::string::~string((string *)&local_98);
      checkParamUpdates(this,&fullKey,(RpcValue *)0x0);
    }
    names::Path::~Path(&path);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_parameterLock);
  ::std::__cxx11::string::~string((string *)&fullKey);
  return bVar1;
}

Assistant:

bool ParameterStorage::deleteParam(const std::string& caller_id, const std::string& key)
{
  MINIROS_INFO_NAMED("rosparam", "deleteParam %s from %s", key.c_str(), caller_id.c_str());
  std::string fullKey = miniros::names::resolve(caller_id, key, false);

  std::scoped_lock<std::mutex> m_lock(m_parameterLock);
  if (fullKey == "/") {
    m_parameterRoot = RpcValue::Dict();
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  names::Path path;
  path.fromString(fullKey);

  auto p = findParameter(path, false);
  if (p.first && p.second) {
    p.second->eraseMember(path.name());
    checkParamUpdates(fullKey, nullptr);
    return true;
  }

  return false;
}